

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteMaterials(ColladaExporter *this)

{
  undefined1 *puVar1;
  vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  *this_00;
  aiMaterial *paVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  string *psVar9;
  __type _Var10;
  bool bVar11;
  aiReturn aVar12;
  ostream *poVar13;
  ulong value;
  long lVar14;
  long lVar15;
  pointer pMVar16;
  _Alloc_hider _Var17;
  unsigned_long value_00;
  Material *mat;
  _Alloc_hider _Var18;
  long lVar19;
  allocator local_501;
  aiMaterial *local_500;
  string *local_4f8;
  ColladaExporter *local_4f0;
  aiShadingMode shading;
  Surface *local_4c8;
  Surface *local_4c0;
  Surface *local_4b8;
  Surface *local_4b0;
  Surface *local_4a8;
  Surface *local_4a0;
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  aiString name;
  
  this_00 = &this->materials;
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::resize(this_00,(ulong)this->mScene->mNumMaterials);
  lVar19 = 0;
  value = 0;
  lVar15 = 0;
  local_4f0 = this;
  while( true ) {
    if (this->mScene->mNumMaterials <= value) break;
    paVar2 = this->mScene->mMaterials[value];
    name.length = 0;
    name.data[0] = '\0';
    memset(name.data + 1,0x1b,0x3ff);
    local_500 = paVar2;
    aVar12 = aiGetMaterialString(paVar2,"?mat.name",0,0,&name);
    local_4f8 = (string *)lVar19;
    if (aVar12 == aiReturn_SUCCESS) {
      std::__cxx11::string::string((string *)&shading,name.data,(allocator *)&local_458);
      value_00 = 0;
      for (lVar14 = 0; lVar19 != lVar14; lVar14 = lVar14 + 0x218) {
        _Var10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&(((this_00->
                                              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->name).
                                            _M_dataplus._M_p + lVar14),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&shading);
        value_00 = value_00 + _Var10;
      }
      if (value_00 == 0) {
        std::__cxx11::string::assign
                  ((char *)((this_00->
                            super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                            )._M_impl.super__Vector_impl_data._M_start + value));
      }
      else {
        std::__cxx11::string::string((string *)&local_478,name.data,&local_501);
        to_string<unsigned_long>(&local_498,value_00);
        std::operator+(&local_458,&local_478,&local_498);
        std::__cxx11::string::operator=
                  ((string *)
                   ((this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start + value),(string *)&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_498);
        std::__cxx11::string::~string((string *)&local_478);
      }
      std::__cxx11::string::~string((string *)&shading);
    }
    else {
      aiString::Set(&name,"mat");
      std::__cxx11::string::string((string *)&local_478,"m",&local_501);
      to_string<unsigned_long>(&local_498,value);
      std::operator+(&local_458,&local_478,&local_498);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &local_458,name.data);
      std::__cxx11::string::operator=
                ((string *)
                 ((this_00->
                  super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                  )._M_impl.super__Vector_impl_data._M_start + value),(string *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&local_478);
    }
    pMVar16 = (this_00->
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              )._M_impl.super__Vector_impl_data._M_start;
    _Var17._M_p = pMVar16[value].name._M_dataplus._M_p;
    for (_Var18._M_p = _Var17._M_p;
        _Var18._M_p != _Var17._M_p + pMVar16[value].name._M_string_length;
        _Var18._M_p = _Var18._M_p + 1) {
      bVar11 = isalnum_C(*_Var18._M_p);
      if (!bVar11) {
        *_Var18._M_p = '_';
        pMVar16 = (this_00->
                  super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        _Var17._M_p = pMVar16[value].name._M_dataplus._M_p;
      }
    }
    shading = aiShadingMode_Flat;
    std::__cxx11::string::assign((char *)&pMVar16[value].shading_model);
    paVar2 = local_500;
    aVar12 = aiMaterial::Get<aiShadingMode>(local_500,"$mat.shadingm",0,0,&shading);
    if (((aVar12 == aiReturn_SUCCESS) && (shading - aiShadingMode_Gouraud < 8)) &&
       ((0x87U >> (shading - aiShadingMode_Gouraud & 0x1f) & 1) != 0)) {
      std::__cxx11::string::assign
                ((char *)&(this_00->
                          super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                          )._M_impl.super__Vector_impl_data._M_start[value].shading_model);
    }
    this = local_4f0;
    ReadMaterialSurface(local_4f0,
                        &(local_4f0->materials).
                         super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                         ._M_impl.super__Vector_impl_data._M_start[value].ambient,paVar2,
                        aiTextureType_AMBIENT,"$clr.ambient",0,0);
    pMVar16 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar3 = pMVar16[value].ambient.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar16[value].diffuse,paVar2,aiTextureType_DIFFUSE,"$clr.diffuse",0,0
                       );
    pMVar16 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar4 = pMVar16[value].diffuse.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar16[value].specular,paVar2,aiTextureType_SPECULAR,"$clr.specular",
                        0,0);
    pMVar16 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar5 = pMVar16[value].specular.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar16[value].emissive,paVar2,aiTextureType_EMISSIVE,"$clr.emissive",
                        0,0);
    pMVar16 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar6 = pMVar16[value].emissive.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar16[value].reflective,paVar2,aiTextureType_REFLECTION,
                        "$clr.reflective",0,0);
    pMVar16 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar7 = pMVar16[value].reflective.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar16[value].transparent,paVar2,aiTextureType_OPACITY,
                        "$clr.transparent",0,0);
    pMVar16 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar8 = pMVar16[value].transparent.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar16[value].normal,paVar2,aiTextureType_NORMALS,(char *)0x0,0,0);
    pMVar16 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar15 = (((((((lVar15 - (ulong)(sVar3 == 0)) - (ulong)(sVar4 == 0)) - (ulong)(sVar5 == 0)) -
                (ulong)(sVar6 == 0)) - (ulong)(sVar7 == 0)) - (ulong)(sVar8 == 0)) + 7) -
             (ulong)(pMVar16[value].normal.texture._M_string_length == 0);
    aVar12 = aiGetMaterialFloat(paVar2,"$mat.shininess",0,0,&pMVar16[value].shininess.value);
    (this->materials).
    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
    ._M_impl.super__Vector_impl_data._M_start[value].shininess.exist = aVar12 == aiReturn_SUCCESS;
    aVar12 = aiGetMaterialFloat(paVar2,"$mat.opacity",0,0,
                                &(this->materials).
                                 super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                                 ._M_impl.super__Vector_impl_data._M_start[value].transparency.value
                               );
    (this->materials).
    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
    ._M_impl.super__Vector_impl_data._M_start[value].transparency.exist = aVar12 == aiReturn_SUCCESS
    ;
    aVar12 = aiGetMaterialFloat(paVar2,"$mat.refracti",0,0,
                                &(this->materials).
                                 super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                                 ._M_impl.super__Vector_impl_data._M_start[value].index_refraction.
                                 value);
    (this->materials).
    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
    ._M_impl.super__Vector_impl_data._M_start[value].index_refraction.exist =
         aVar12 == aiReturn_SUCCESS;
    value = value + 1;
    lVar19 = (long)local_4f8 + 0x218;
  }
  if (lVar15 != 0) {
    local_4f8 = (string *)&this->startstr;
    poVar13 = std::operator<<((ostream *)&this->field_0x38,local_4f8);
    poVar13 = std::operator<<(poVar13,"<library_images>");
    local_500 = (aiMaterial *)&this->endstr;
    std::operator<<(poVar13,(string *)local_500);
    PushTag(this);
    for (pMVar16 = (this->materials).
                   super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pMVar16 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish; pMVar16 = pMVar16 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar16->name,"-ambient-image");
      WriteImageEntry(this,&pMVar16->ambient,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar16->name,"-diffuse-image");
      WriteImageEntry(this,&pMVar16->diffuse,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar16->name,"-specular-image");
      WriteImageEntry(this,&pMVar16->specular,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar16->name,"-emission-image");
      WriteImageEntry(this,&pMVar16->emissive,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar16->name,"-reflective-image");
      WriteImageEntry(this,&pMVar16->reflective,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar16->name,"-transparent-image");
      WriteImageEntry(this,&pMVar16->transparent,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar16->name,"-normal-image");
      WriteImageEntry(this,&pMVar16->normal,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
    }
    PopTag(this);
    poVar13 = std::operator<<((ostream *)&this->field_0x38,local_4f8);
    poVar13 = std::operator<<(poVar13,"</library_images>");
    std::operator<<(poVar13,(string *)local_500);
  }
  if ((this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar1 = &this->field_0x38;
    local_4f8 = (string *)&this->startstr;
    poVar13 = std::operator<<((ostream *)puVar1,local_4f8);
    poVar13 = std::operator<<(poVar13,"<library_effects>");
    local_500 = (aiMaterial *)&this->endstr;
    std::operator<<(poVar13,(string *)local_500);
    PushTag(this);
    for (pMVar16 = (this->materials).
                   super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pMVar16 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish; pMVar16 = pMVar16 + 1) {
      poVar13 = std::operator<<((ostream *)puVar1,local_4f8);
      poVar13 = std::operator<<(poVar13,"<effect id=\"");
      XMLEscape((string *)&name,&pMVar16->name);
      poVar13 = std::operator<<(poVar13,(string *)&name);
      poVar13 = std::operator<<(poVar13,"-fx\" name=\"");
      XMLEscape((string *)&shading,&pMVar16->name);
      poVar13 = std::operator<<(poVar13,(string *)&shading);
      poVar13 = std::operator<<(poVar13,"\">");
      std::operator<<(poVar13,(string *)local_500);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      PushTag(this);
      poVar13 = std::operator<<((ostream *)puVar1,local_4f8);
      poVar13 = std::operator<<(poVar13,"<profile_COMMON>");
      std::operator<<(poVar13,(string *)local_500);
      PushTag(this);
      std::__cxx11::string::string((string *)&name,"emission",(allocator *)&shading);
      local_4f0 = (ColladaExporter *)&pMVar16->emissive;
      WriteTextureParamEntry(this,(Surface *)local_4f0,(string *)&name,&pMVar16->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"ambient",(allocator *)&shading);
      local_4a0 = &pMVar16->ambient;
      WriteTextureParamEntry(this,local_4a0,(string *)&name,&pMVar16->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"diffuse",(allocator *)&shading);
      local_4a8 = &pMVar16->diffuse;
      WriteTextureParamEntry(this,local_4a8,(string *)&name,&pMVar16->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"specular",(allocator *)&shading);
      local_4b0 = &pMVar16->specular;
      WriteTextureParamEntry(this,local_4b0,(string *)&name,&pMVar16->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"reflective",(allocator *)&shading);
      WriteTextureParamEntry(this,&pMVar16->reflective,(string *)&name,&pMVar16->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"transparent",(allocator *)&shading);
      WriteTextureParamEntry(this,&pMVar16->transparent,(string *)&name,&pMVar16->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"normal",(allocator *)&shading);
      local_4c8 = &pMVar16->normal;
      local_4c0 = &pMVar16->transparent;
      local_4b8 = &pMVar16->reflective;
      WriteTextureParamEntry(this,local_4c8,(string *)&name,&pMVar16->name);
      std::__cxx11::string::~string((string *)&name);
      psVar9 = local_4f8;
      poVar13 = std::operator<<((ostream *)puVar1,local_4f8);
      poVar13 = std::operator<<(poVar13,"<technique sid=\"standard\">");
      paVar2 = local_500;
      std::operator<<(poVar13,(string *)local_500);
      PushTag(this);
      poVar13 = std::operator<<((ostream *)puVar1,psVar9);
      poVar13 = std::operator<<(poVar13,"<");
      poVar13 = std::operator<<(poVar13,(string *)&pMVar16->shading_model);
      poVar13 = std::operator<<(poVar13,">");
      std::operator<<(poVar13,(string *)paVar2);
      PushTag(this);
      std::__cxx11::string::string((string *)&name,"emission",(allocator *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar16->name,"-emission-sampler");
      WriteTextureColorEntry
                (this,(Surface *)local_4f0,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"ambient",(allocator *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar16->name,"-ambient-sampler");
      WriteTextureColorEntry
                (this,local_4a0,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"diffuse",(allocator *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar16->name,"-diffuse-sampler");
      WriteTextureColorEntry
                (this,local_4a8,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"specular",(allocator *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar16->name,"-specular-sampler");
      WriteTextureColorEntry
                (this,local_4b0,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"shininess",(allocator *)&shading);
      WriteFloatEntry(this,&pMVar16->shininess,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"reflective",(allocator *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar16->name,"-reflective-sampler");
      WriteTextureColorEntry
                (this,local_4b8,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"transparent",(allocator *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar16->name,"-transparent-sampler");
      WriteTextureColorEntry
                (this,local_4c0,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"transparency",(allocator *)&shading);
      WriteFloatEntry(this,&pMVar16->transparency,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&name,"index_of_refraction",(allocator *)&shading);
      WriteFloatEntry(this,&pMVar16->index_refraction,(string *)&name);
      local_4f0 = (ColladaExporter *)&pMVar16->shading_model;
      std::__cxx11::string::~string((string *)&name);
      if ((pMVar16->normal).texture._M_string_length != 0) {
        std::__cxx11::string::string((string *)&name,"bump",(allocator *)&local_458);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading
                       ,&pMVar16->name,"-normal-sampler");
        WriteTextureColorEntry
                  (this,local_4c8,(string *)&name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
        std::__cxx11::string::~string((string *)&shading);
        std::__cxx11::string::~string((string *)&name);
      }
      PopTag(this);
      psVar9 = local_4f8;
      poVar13 = std::operator<<((ostream *)puVar1,local_4f8);
      poVar13 = std::operator<<(poVar13,"</");
      poVar13 = std::operator<<(poVar13,(string *)local_4f0);
      poVar13 = std::operator<<(poVar13,">");
      paVar2 = local_500;
      std::operator<<(poVar13,(string *)local_500);
      PopTag(this);
      poVar13 = std::operator<<((ostream *)puVar1,psVar9);
      poVar13 = std::operator<<(poVar13,"</technique>");
      std::operator<<(poVar13,(string *)paVar2);
      PopTag(this);
      poVar13 = std::operator<<((ostream *)puVar1,psVar9);
      poVar13 = std::operator<<(poVar13,"</profile_COMMON>");
      std::operator<<(poVar13,(string *)paVar2);
      PopTag(this);
      poVar13 = std::operator<<((ostream *)puVar1,psVar9);
      poVar13 = std::operator<<(poVar13,"</effect>");
      std::operator<<(poVar13,(string *)paVar2);
    }
    PopTag(this);
    psVar9 = local_4f8;
    poVar13 = std::operator<<((ostream *)puVar1,local_4f8);
    poVar13 = std::operator<<(poVar13,"</library_effects>");
    paVar2 = local_500;
    std::operator<<(poVar13,(string *)local_500);
    poVar13 = std::operator<<((ostream *)puVar1,psVar9);
    poVar13 = std::operator<<(poVar13,"<library_materials>");
    std::operator<<(poVar13,(string *)paVar2);
    PushTag(this);
    for (pMVar16 = (this->materials).
                   super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pMVar16 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish; pMVar16 = pMVar16 + 1) {
      poVar13 = std::operator<<((ostream *)puVar1,local_4f8);
      poVar13 = std::operator<<(poVar13,"<material id=\"");
      XMLEscape((string *)&name,&pMVar16->name);
      poVar13 = std::operator<<(poVar13,(string *)&name);
      poVar13 = std::operator<<(poVar13,"\" name=\"");
      poVar13 = std::operator<<(poVar13,(string *)pMVar16);
      poVar13 = std::operator<<(poVar13,"\">");
      std::operator<<(poVar13,(string *)local_500);
      std::__cxx11::string::~string((string *)&name);
      PushTag(this);
      poVar13 = std::operator<<((ostream *)puVar1,local_4f8);
      poVar13 = std::operator<<(poVar13,"<instance_effect url=\"#");
      XMLEscape((string *)&name,&pMVar16->name);
      poVar13 = std::operator<<(poVar13,(string *)&name);
      poVar13 = std::operator<<(poVar13,"-fx\"/>");
      std::operator<<(poVar13,(string *)local_500);
      std::__cxx11::string::~string((string *)&name);
      PopTag(this);
      poVar13 = std::operator<<((ostream *)puVar1,local_4f8);
      poVar13 = std::operator<<(poVar13,"</material>");
      std::operator<<(poVar13,(string *)local_500);
    }
    PopTag(this);
    poVar13 = std::operator<<((ostream *)puVar1,local_4f8);
    poVar13 = std::operator<<(poVar13,"</library_materials>");
    std::operator<<(poVar13,(string *)local_500);
  }
  return;
}

Assistant:

void ColladaExporter::WriteMaterials()
{
  materials.resize( mScene->mNumMaterials);

  /// collect all materials from the scene
  size_t numTextures = 0;
  for( size_t a = 0; a < mScene->mNumMaterials; ++a )
  {
    const aiMaterial* mat = mScene->mMaterials[a];

    aiString name;
    if( mat->Get( AI_MATKEY_NAME, name) != aiReturn_SUCCESS ) {
      name = "mat";
      materials[a].name = std::string( "m") + to_string(a) + name.C_Str();
    } else {
      // try to use the material's name if no other material has already taken it, else append #
      std::string testName = name.C_Str();
      size_t materialCountWithThisName = 0;
      for( size_t i = 0; i < a; i ++ ) {
        if( materials[i].name == testName ) {
          materialCountWithThisName ++;
        }
      }
      if( materialCountWithThisName == 0 ) {
        materials[a].name = name.C_Str();
      } else {
        materials[a].name = std::string(name.C_Str()) + to_string(materialCountWithThisName);
      }
    }
    for( std::string::iterator it = materials[a].name.begin(); it != materials[a].name.end(); ++it ) {
      if( !isalnum_C( *it ) ) {
        *it = '_';
      }
    }

    aiShadingMode shading = aiShadingMode_Flat;
    materials[a].shading_model = "phong";
    if(mat->Get( AI_MATKEY_SHADING_MODEL, shading) == aiReturn_SUCCESS) {
        if(shading == aiShadingMode_Phong) {
            materials[a].shading_model = "phong";
        } else if(shading == aiShadingMode_Blinn) {
            materials[a].shading_model = "blinn";
        } else if(shading == aiShadingMode_NoShading) {
            materials[a].shading_model = "constant";
        } else if(shading == aiShadingMode_Gouraud) {
            materials[a].shading_model = "lambert";
        }
    }

    ReadMaterialSurface( materials[a].ambient, mat, aiTextureType_AMBIENT, AI_MATKEY_COLOR_AMBIENT);
    if( !materials[a].ambient.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].diffuse, mat, aiTextureType_DIFFUSE, AI_MATKEY_COLOR_DIFFUSE);
    if( !materials[a].diffuse.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].specular, mat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
    if( !materials[a].specular.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].emissive, mat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);
    if( !materials[a].emissive.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].reflective, mat, aiTextureType_REFLECTION, AI_MATKEY_COLOR_REFLECTIVE);
    if( !materials[a].reflective.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].transparent, mat, aiTextureType_OPACITY, AI_MATKEY_COLOR_TRANSPARENT);
    if( !materials[a].transparent.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].normal, mat, aiTextureType_NORMALS, NULL, 0, 0);
    if( !materials[a].normal.texture.empty() ) numTextures++;

    materials[a].shininess.exist = mat->Get( AI_MATKEY_SHININESS, materials[a].shininess.value) == aiReturn_SUCCESS;
    materials[a].transparency.exist = mat->Get( AI_MATKEY_OPACITY, materials[a].transparency.value) == aiReturn_SUCCESS;
    materials[a].index_refraction.exist = mat->Get( AI_MATKEY_REFRACTI, materials[a].index_refraction.value) == aiReturn_SUCCESS;
  }

  // output textures if present
  if( numTextures > 0 )
  {
    mOutput << startstr << "<library_images>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      WriteImageEntry( mat.ambient, mat.name + "-ambient-image");
      WriteImageEntry( mat.diffuse, mat.name + "-diffuse-image");
      WriteImageEntry( mat.specular, mat.name + "-specular-image");
      WriteImageEntry( mat.emissive, mat.name + "-emission-image");
      WriteImageEntry( mat.reflective, mat.name + "-reflective-image");
      WriteImageEntry( mat.transparent, mat.name + "-transparent-image");
      WriteImageEntry( mat.normal, mat.name + "-normal-image");
    }
    PopTag();
    mOutput << startstr << "</library_images>" << endstr;
  }

  // output effects - those are the actual carriers of information
  if( !materials.empty() )
  {
    mOutput << startstr << "<library_effects>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      // this is so ridiculous it must be right
      mOutput << startstr << "<effect id=\"" << XMLEscape(mat.name) << "-fx\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<profile_COMMON>" << endstr;
      PushTag();

      // write sampler- and surface params for the texture entries
      WriteTextureParamEntry( mat.emissive, "emission", mat.name);
      WriteTextureParamEntry( mat.ambient, "ambient", mat.name);
      WriteTextureParamEntry( mat.diffuse, "diffuse", mat.name);
      WriteTextureParamEntry( mat.specular, "specular", mat.name);
      WriteTextureParamEntry( mat.reflective, "reflective", mat.name);
      WriteTextureParamEntry( mat.transparent, "transparent", mat.name);
      WriteTextureParamEntry( mat.normal, "normal", mat.name);

      mOutput << startstr << "<technique sid=\"standard\">" << endstr;
      PushTag();
      mOutput << startstr << "<" << mat.shading_model << ">" << endstr;
      PushTag();

      WriteTextureColorEntry( mat.emissive, "emission", mat.name + "-emission-sampler");
      WriteTextureColorEntry( mat.ambient, "ambient", mat.name + "-ambient-sampler");
      WriteTextureColorEntry( mat.diffuse, "diffuse", mat.name + "-diffuse-sampler");
      WriteTextureColorEntry( mat.specular, "specular", mat.name + "-specular-sampler");
      WriteFloatEntry(mat.shininess, "shininess");
      WriteTextureColorEntry( mat.reflective, "reflective", mat.name + "-reflective-sampler");
      WriteTextureColorEntry( mat.transparent, "transparent", mat.name + "-transparent-sampler");
      WriteFloatEntry(mat.transparency, "transparency");
      WriteFloatEntry(mat.index_refraction, "index_of_refraction");

      if(! mat.normal.texture.empty()) {
        WriteTextureColorEntry( mat.normal, "bump", mat.name + "-normal-sampler");
      }

      PopTag();
      mOutput << startstr << "</" << mat.shading_model << ">" << endstr;
      PopTag();
      mOutput << startstr << "</technique>" << endstr;
      PopTag();
      mOutput << startstr << "</profile_COMMON>" << endstr;
      PopTag();
      mOutput << startstr << "</effect>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_effects>" << endstr;

    // write materials - they're just effect references
    mOutput << startstr << "<library_materials>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      mOutput << startstr << "<material id=\"" << XMLEscape(mat.name) << "\" name=\"" << mat.name << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<instance_effect url=\"#" << XMLEscape(mat.name) << "-fx\"/>" << endstr;
      PopTag();
      mOutput << startstr << "</material>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_materials>" << endstr;
  }
}